

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O3

void __thiscall QSliderPrivate::resetLayoutItemMargins(QSliderPrivate *this)

{
  undefined8 uVar1;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  QStyleOptionSlider *pQVar5;
  long in_FS_OFFSET;
  QStyleOptionSlider opt;
  QStyleOptionSlider local_a0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar4 = &DAT_006dcd20;
  pQVar5 = &local_a0;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *puVar4;
    (pQVar5->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar5->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar4 = puVar4 + 1;
    pQVar5 = (QStyleOptionSlider *)&(pQVar5->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_a0);
  (**(code **)(*plVar2 + 0x1a8))(plVar2,&local_a0);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)this,SE_SliderLayoutItem,(QStyleOption *)&local_a0);
  QStyleOption::~QStyleOption((QStyleOption *)&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSliderPrivate::resetLayoutItemMargins()
{
    Q_Q(QSlider);
    QStyleOptionSlider opt;
    // ### This is (also) reached from the ctor which is unfortunate since a possible
    // ### re-implementation of initStyleOption is then not called.
    q->initStyleOption(&opt);
    setLayoutItemMargins(QStyle::SE_SliderLayoutItem, &opt);
}